

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void transition(tgestate_t *state,mappos8_t *mappos)

{
  long lVar1;
  byte *in_RSI;
  long in_RDI;
  vischar_t *in_stack_00000008;
  room_t room_index;
  vischar_t *vischar;
  
  lVar1 = *(long *)(in_RDI + 0x108);
  if (*(char *)(lVar1 + 0x3c) == '\0') {
    *(ushort *)(lVar1 + 0x20) = (ushort)*in_RSI << 2;
    *(ushort *)(lVar1 + 0x22) = (ushort)in_RSI[1] << 2;
    *(ushort *)(lVar1 + 0x24) = (ushort)in_RSI[2] << 2;
  }
  else {
    *(ushort *)(lVar1 + 0x20) = (ushort)*in_RSI;
    *(ushort *)(lVar1 + 0x22) = (ushort)in_RSI[1];
    *(ushort *)(lVar1 + 0x24) = (ushort)in_RSI[2];
  }
  if (lVar1 == in_RDI + 0x3c0) {
    *(byte *)(lVar1 + 1) = *(byte *)(lVar1 + 1) & 0x7f;
    *(char *)(in_RDI + 0x120) = *(char *)(in_RDI + 0x3fc);
    if (*(char *)(in_RDI + 0x3fc) == '\0') {
      *(undefined1 *)(lVar1 + 0x19) = 0x80;
      *(byte *)(lVar1 + 0x1a) = *(byte *)(lVar1 + 0x1a) & 3;
      reset_outdoors((tgestate_t *)0x106265);
      squash_stack_goto_main((tgestate_t *)0x10626f);
    }
    else {
      enter_room((tgestate_t *)0x10627b);
    }
  }
  else {
    reset_visible_character((tgestate_t *)vischar,in_stack_00000008);
  }
  return;
}

Assistant:

void transition(tgestate_t *state, const mappos8_t *mappos)
{
  vischar_t *vischar;    /* was IY */
  room_t     room_index; /* was A */

  assert(state  != NULL);
  assert(mappos != NULL);

  vischar = state->IY;
  ASSERT_VISCHAR_VALID(vischar);

  if (vischar->room == room_0_OUTDOORS)
  {
    /* Outdoors */

    /* Set position on X axis, Y axis and height (multiplying by 4). */

    /* Conv: This was unrolled (compared to the original) to avoid having to
     * access the structure as an array. */
    vischar->mi.mappos.u = mappos->u * 4;
    vischar->mi.mappos.v = mappos->v * 4;
    vischar->mi.mappos.w = mappos->w * 4;
  }
  else
  {
    /* Indoors */

    /* Set position on X axis, Y axis and height (copying). */

    /* Conv: This was unrolled (compared to the original) to avoid having to
     * access the structure as an array. */
    vischar->mi.mappos.u = mappos->u;
    vischar->mi.mappos.v = mappos->v;
    vischar->mi.mappos.w = mappos->w;
  }

  if (vischar != &state->vischars[0])
  {
    /* Not the hero. */

    reset_visible_character(state, vischar); /* was tail call */
  }
  else
  {
    /* Hero only. */

    vischar->flags &= ~vischar_FLAGS_NO_COLLIDE;
    state->room_index = room_index = state->vischars[0].room;
    if (room_index == room_0_OUTDOORS)
    {
      /* Outdoors */

      vischar->input = input_KICK;
      vischar->direction &= vischar_DIRECTION_MASK; /* clear crawl flag */
      reset_outdoors(state);
      squash_stack_goto_main(state); /* was tail call */
    }
    else
    {
      /* Indoors */

      enter_room(state); /* was fallthrough */
    }
    NEVER_RETURNS;
  }
}